

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntegrationPoints.h
# Opt level: O2

IntegrationPointList<2> *
anurbs::IntegrationPoints::get
          (IntegrationPointList<2> *__return_storage_ptr__,size_t degree_u,size_t degree_v,
          Interval *domain_u,Interval *domain_v)

{
  double dVar1;
  double dVar2;
  double dVar3;
  tuple<double,_double> *norm_point_u;
  long lVar4;
  _Head_base<0UL,_double,_false> *p_Var5;
  tuple<double,_double> *norm_point_v;
  pointer ptVar6;
  IntegrationPointList<1> integration_points_v;
  IntegrationPointList<1> integration_points_u;
  allocator_type local_51;
  _Vector_base<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_> local_50;
  _Vector_base<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_> local_38;
  
  get((IntegrationPointList<1> *)&local_38,degree_u,domain_u);
  get((IntegrationPointList<1> *)&local_50,degree_v,domain_v);
  std::
  vector<std::tuple<double,_double,_double>,_std::allocator<std::tuple<double,_double,_double>_>_>::
  vector(__return_storage_ptr__,degree_v * degree_u,&local_51);
  lVar4 = 0;
  for (; local_38._M_impl.super__Vector_impl_data._M_start !=
         local_38._M_impl.super__Vector_impl_data._M_finish;
      local_38._M_impl.super__Vector_impl_data._M_start =
           local_38._M_impl.super__Vector_impl_data._M_start + 1) {
    p_Var5 = &(__return_storage_ptr__->
              super__Vector_base<std::tuple<double,_double,_double>,_std::allocator<std::tuple<double,_double,_double>_>_>
              )._M_impl.super__Vector_impl_data._M_start[lVar4].
              super__Tuple_impl<0UL,_double,_double,_double>.super__Head_base<0UL,_double,_false>;
    for (ptVar6 = local_50._M_impl.super__Vector_impl_data._M_start;
        ptVar6 != local_50._M_impl.super__Vector_impl_data._M_finish; ptVar6 = ptVar6 + 1) {
      dVar1 = ((local_38._M_impl.super__Vector_impl_data._M_start)->
              super__Tuple_impl<0UL,_double,_double>).super__Tuple_impl<1UL,_double>.
              super__Head_base<1UL,_double,_false>._M_head_impl;
      dVar2 = (ptVar6->super__Tuple_impl<0UL,_double,_double>).super__Tuple_impl<1UL,_double>.
              super__Head_base<1UL,_double,_false>._M_head_impl;
      dVar3 = (ptVar6->super__Tuple_impl<0UL,_double,_double>).super__Head_base<0UL,_double,_false>.
              _M_head_impl;
      lVar4 = lVar4 + 1;
      p_Var5->_M_head_impl =
           ((local_38._M_impl.super__Vector_impl_data._M_start)->
           super__Tuple_impl<0UL,_double,_double>).super__Head_base<0UL,_double,_false>._M_head_impl
      ;
      ((_Head_base<1UL,_double,_false> *)(p_Var5 + -1))->_M_head_impl = dVar3;
      (((_Tuple_impl<0UL,_double,_double,_double> *)(p_Var5 + -2))->
      super__Tuple_impl<1UL,_double,_double>).super__Tuple_impl<2UL,_double>.
      super__Head_base<2UL,_double,_false> = (_Head_base<2UL,_double,_false>)(dVar1 * dVar2);
      p_Var5 = p_Var5 + 3;
    }
  }
  std::_Vector_base<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>::
  ~_Vector_base(&local_50);
  std::_Vector_base<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>::
  ~_Vector_base(&local_38);
  return __return_storage_ptr__;
}

Assistant:

static IntegrationPointList<2> get(const size_t degree_u,
        const size_t degree_v, const Interval& domain_u,
        const Interval& domain_v)
    {
        const auto integration_points_u = get(degree_u, domain_u);
        const auto integration_points_v = get(degree_v, domain_v);

        IntegrationPointList<2> integration_points(degree_u * degree_v);

        Index i = 0;

        for (const auto& norm_point_u : integration_points_u) {
            for (const auto& norm_point_v : integration_points_v) {
                integration_points[i++] = IntegrationPoint<2>(
                    std::get<0>(norm_point_u), std::get<0>(norm_point_v),
                    std::get<1>(norm_point_u) * std::get<1>(norm_point_v));
            }
        }

        return integration_points;
    }